

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_tess_level.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_60dd4::lower_tess_level_visitor::fix_lhs
          (lower_tess_level_visitor *this,ir_assignment *ir)

{
  ir_dereference *piVar1;
  ir_rvalue *lhs;
  exec_node *peVar2;
  glsl_type *type;
  int iVar3;
  void *mem_ctx_00;
  ir_constant *this_00;
  ir_expression *this_01;
  undefined4 extraout_var;
  bool bVar4;
  ir_constant *old_index_constant;
  ir_dereference *new_lhs;
  ir_expression *expr;
  void *mem_ctx;
  ir_assignment *ir_local;
  lower_tess_level_visitor *this_local;
  
  if ((ir->lhs->super_ir_rvalue).super_ir_instruction.ir_type == ir_type_expression) {
    mem_ctx_00 = ralloc_parent(ir);
    piVar1 = ir->lhs;
    if (*(int *)&piVar1[1].super_ir_rvalue.super_ir_instruction._vptr_ir_instruction != 0x8e) {
      __assert_fail("expr->operation == ir_binop_vector_extract",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                    ,0x105,
                    "void (anonymous namespace)::lower_tess_level_visitor::fix_lhs(ir_assignment *)"
                   );
    }
    if (*(int *)&piVar1[1].super_ir_rvalue.super_ir_instruction.super_exec_node.next[1].prev != 2) {
      __assert_fail("expr->operands[0]->ir_type == ir_type_dereference_variable",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                    ,0x106,
                    "void (anonymous namespace)::lower_tess_level_visitor::fix_lhs(ir_assignment *)"
                   );
    }
    bVar4 = true;
    if ((glsl_type *)piVar1[1].super_ir_rvalue.super_ir_instruction.super_exec_node.next[2].next !=
        &glsl_type::_vec4_type) {
      bVar4 = (glsl_type *)
              piVar1[1].super_ir_rvalue.super_ir_instruction.super_exec_node.next[2].next ==
              &glsl_type::_vec2_type;
    }
    if (!bVar4) {
      __assert_fail("(expr->operands[0]->type == glsl_type::vec4_type) || (expr->operands[0]->type == glsl_type::vec2_type)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/lower_tess_level.cpp"
                    ,0x108,
                    "void (anonymous namespace)::lower_tess_level_visitor::fix_lhs(ir_assignment *)"
                   );
    }
    lhs = (ir_rvalue *)piVar1[1].super_ir_rvalue.super_ir_instruction.super_exec_node.next;
    peVar2 = piVar1[1].super_ir_rvalue.super_ir_instruction.super_exec_node.prev;
    this_00 = (ir_constant *)(*(code *)peVar2->next[3].next)(peVar2,mem_ctx_00,0);
    if (this_00 == (ir_constant *)0x0) {
      this_01 = (ir_expression *)exec_node::operator_new(0x58,mem_ctx_00);
      type = (glsl_type *)
             piVar1[1].super_ir_rvalue.super_ir_instruction.super_exec_node.next[2].next;
      iVar3 = (*(lhs->super_ir_instruction)._vptr_ir_instruction[4])(lhs,mem_ctx_00,0);
      ir_expression::ir_expression
                (this_01,0x96,type,(ir_rvalue *)CONCAT44(extraout_var,iVar3),ir->rhs,
                 (ir_rvalue *)piVar1[1].super_ir_rvalue.super_ir_instruction.super_exec_node.prev,
                 (ir_rvalue *)0x0);
      ir->rhs = (ir_rvalue *)this_01;
    }
    ir_assignment::set_lhs(ir,lhs);
    if (this_00 == (ir_constant *)0x0) {
      ir->field_0x38 =
           ir->field_0x38 & 0xf0 |
           (char)(1 << (*(byte *)&(piVar1[1].super_ir_rvalue.super_ir_instruction.super_exec_node.
                                   next[2].next)->prev & 0x1f)) - 1U & 0xf;
    }
    else {
      iVar3 = ir_constant::get_int_component(this_00,0);
      ir->field_0x38 = ir->field_0x38 & 0xf0 | (byte)(1 << ((byte)iVar3 & 0x1f)) & 0xf;
    }
  }
  return;
}

Assistant:

void
lower_tess_level_visitor::fix_lhs(ir_assignment *ir)
{
   if (ir->lhs->ir_type != ir_type_expression)
      return;
   void *mem_ctx = ralloc_parent(ir);
   ir_expression *const expr = (ir_expression *) ir->lhs;

   /* The expression must be of the form:
    *
    *     (vector_extract gl_TessLevel*MESA, j).
    */
   assert(expr->operation == ir_binop_vector_extract);
   assert(expr->operands[0]->ir_type == ir_type_dereference_variable);
   assert((expr->operands[0]->type == glsl_type::vec4_type) ||
          (expr->operands[0]->type == glsl_type::vec2_type));

   ir_dereference *const new_lhs = (ir_dereference *) expr->operands[0];

   ir_constant *old_index_constant =
      expr->operands[1]->constant_expression_value(mem_ctx);
   if (!old_index_constant) {
      ir->rhs = new(mem_ctx) ir_expression(ir_triop_vector_insert,
                                           expr->operands[0]->type,
                                           new_lhs->clone(mem_ctx, NULL),
                                           ir->rhs,
                                           expr->operands[1]);
   }
   ir->set_lhs(new_lhs);

   if (old_index_constant) {
      /* gl_TessLevel* is being accessed via a constant index.  Don't bother
       * creating a vector insert op. Just use a write mask.
       */
      ir->write_mask = 1 << old_index_constant->get_int_component(0);
   } else {
      ir->write_mask = (1 << expr->operands[0]->type->vector_elements) - 1;
   }
}